

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_open_fd.c
# Opt level: O0

ssize_t file_read(archive_conflict *a,void *client_data,void **buff)

{
  ssize_t sVar1;
  int *piVar2;
  ssize_t bytes_read;
  read_file_data *mine;
  void **buff_local;
  void *client_data_local;
  archive_conflict *a_local;
  
  *buff = *(void **)((long)client_data + 0x10);
  do {
    sVar1 = read(*client_data,*(void **)((long)client_data + 0x10),
                 *(size_t *)((long)client_data + 8));
    if (-1 < sVar1) {
      return sVar1;
    }
    piVar2 = __errno_location();
  } while (*piVar2 == 4);
  if (*(int *)((long)client_data + 0x20) == 0) {
    piVar2 = __errno_location();
    archive_set_error((archive *)a,*piVar2,"Error reading stdin");
  }
  else if (*(int *)((long)client_data + 0x20) == 1) {
    piVar2 = __errno_location();
    archive_set_error((archive *)a,*piVar2,"Error reading \'%s\'",(long)client_data + 0x24);
  }
  else {
    piVar2 = __errno_location();
    archive_set_error((archive *)a,*piVar2,"Error reading \'%ls\'",(long)client_data + 0x24);
  }
  return sVar1;
}

Assistant:

static ssize_t
file_read(struct archive *a, void *client_data, const void **buff)
{
	struct read_fd_data *mine = (struct read_fd_data *)client_data;
	ssize_t bytes_read;

	*buff = mine->buffer;
	for (;;) {
		bytes_read = read(mine->fd, mine->buffer, mine->block_size);
		if (bytes_read < 0) {
			if (errno == EINTR)
				continue;
			archive_set_error(a, errno, "Error reading fd %d",
			    mine->fd);
		}
		return (bytes_read);
	}
}